

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lockedint.h
# Opt level: O0

void locked_inc_u64(tsdn_t *tsdn,malloc_mutex_t *mtx,locked_u64_t *p,uint64_t x)

{
  uint64_t x_local;
  locked_u64_t *p_local;
  malloc_mutex_t *mtx_local;
  tsdn_t *tsdn_local;
  
  LOCK();
  (p->val).repr = (p->val).repr + x;
  UNLOCK();
  return;
}

Assistant:

static inline void
locked_inc_u64(tsdn_t *tsdn, malloc_mutex_t *mtx, locked_u64_t *p,
    uint64_t x) {
	LOCKEDINT_MTX_ASSERT_INTERNAL(tsdn, mtx);
#ifdef JEMALLOC_ATOMIC_U64
	atomic_fetch_add_u64(&p->val, x, ATOMIC_RELAXED);
#else
	p->val += x;
#endif
}